

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_SerializationToArray_Test::TestBody
          (OneofTest_SerializationToArray_Test *this)

{
  TestOneof2 *pTVar1;
  bool bVar2;
  FooCase FVar3;
  size_t sVar4;
  uint8_t *puVar5;
  char *pcVar6;
  Arena *pAVar7;
  string *psVar8;
  TestOneof2_NestedMessage *pTVar9;
  TestOneof2_FooGroup *pTVar10;
  char *in_R9;
  AssertHelper local_888;
  Message local_880;
  int local_878;
  int32_t local_874;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_840;
  Message local_838;
  string_view local_830;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__5;
  Message local_800;
  long local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_10;
  uint8_t *end_5;
  uint8_t *start_5;
  string local_7c8 [4];
  int size_5;
  string data_5;
  TestOneof2 message2_5;
  TestOneof2 message1_5;
  Message local_720;
  int local_714;
  int64_t local_710;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_6d8;
  Message local_6d0;
  string_view local_6c8;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__4;
  Message local_698;
  long local_690;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_8;
  uint8_t *end_4;
  uint8_t *start_4;
  string local_660 [4];
  int size_4;
  string data_4;
  TestOneof2 message2_4;
  TestOneof2 message1_4;
  Message local_5b8;
  TestOneof2_NestedEnum local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_578;
  Message local_570;
  string_view local_568;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__3;
  Message local_538;
  long local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_6;
  uint8_t *end_3;
  uint8_t *start_3;
  string local_500 [4];
  int size_3;
  string data_3;
  TestOneof2 message2_3;
  TestOneof2 message1_3;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_420;
  Message local_418;
  string_view local_410;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__2;
  Message local_3e0;
  long local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_4;
  uint8_t *end_2;
  uint8_t *start_2;
  string local_3a8 [4];
  int size_2;
  string data_2;
  TestOneof2 message2_2;
  TestOneof2 message1_2;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2c8;
  Message local_2c0;
  string_view local_2b8;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__1;
  Message local_288;
  long local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_2;
  uint8_t *end_1;
  uint8_t *start_1;
  string local_250 [4];
  int size_1;
  string data_1;
  TestOneof2 message2_1;
  TestOneof2 message1_1;
  Message local_1a8;
  int local_1a0;
  int32_t local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_168;
  Message local_160;
  string_view local_158;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  Message local_128;
  long local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  uint8_t *end;
  uint8_t *start;
  string local_f0 [4];
  int size;
  string data;
  undefined1 local_c0 [8];
  TestOneof2 message2;
  TestOneof2 message1;
  OneofTest_SerializationToArray_Test *this_local;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_c0);
  std::__cxx11::string::string(local_f0);
  proto2_unittest::TestOneof2::set_foo_int((TestOneof2 *)((long)&message2.field_0 + 0x28),0x7b);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong((TestOneof2 *)((long)&message2.field_0 + 0x28));
  start._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_f0);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_f0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2.field_0 + 0x28),puVar5);
  local_120 = (long)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_118,"size","end - start",(int *)((long)&start + 4),&local_120);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_158 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_f0);
  local_141 = protobuf::MessageLite::ParseFromString((MessageLite *)local_c0,local_158);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_140,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_19c = proto2_unittest::TestOneof2::foo_int((TestOneof2 *)local_c0);
  local_1a0 = 0x7b;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_198,"message2.foo_int()","123",&local_19c,&local_1a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message1_1.field_0 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x71c,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message1_1.field_0 + 0x28),&local_1a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message1_1.field_0 + 0x28));
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__cxx11::string::~string(local_f0);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_c0);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2_1.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&data_1.field_2 + 8));
  std::__cxx11::string::string(local_250);
  pTVar1 = (TestOneof2 *)((long)&message2_1.field_0 + 0x28);
  FVar3 = proto2_unittest::TestOneof2::foo_case(pTVar1);
  if (FVar3 != kFooString) {
    proto2_unittest::TestOneof2::clear_foo(pTVar1);
    proto2_unittest::TestOneof2::set_has_foo_string(pTVar1);
    protobuf::internal::ArenaStringPtr::InitDefault
              ((ArenaStringPtr *)((long)&message1_1.field_0 + 0x10));
  }
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)((long)&message1_1.field_0 + 0x10),"foo",pAVar7);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong
                    ((TestOneof2 *)((long)&message2_1.field_0 + 0x28));
  start_1._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_250);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_250);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2_1.field_0 + 0x28),puVar5);
  local_280 = (long)gtest_ar_2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_278,"size","end - start",(int *)((long)&start_1 + 4),&local_280);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x728,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_2b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_250);
  local_2a1 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)((long)&data_1.field_2 + 8),local_2b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar2) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_2a0,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x729,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  psVar8 = proto2_unittest::TestOneof2::foo_string_abi_cxx11_
                     ((TestOneof2 *)((long)&data_1.field_2 + 8));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_2f8,"message2.foo_string()","\"foo\"",psVar8,(char (*) [4])0x1d63234)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message1_2.field_0 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x72a,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message1_2.field_0 + 0x28),&local_300);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message1_2.field_0 + 0x28));
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__cxx11::string::~string(local_250);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&data_1.field_2 + 8));
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2_1.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2_2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&data_2.field_2 + 8));
  std::__cxx11::string::string(local_3a8);
  pTVar1 = (TestOneof2 *)((long)&message2_2.field_0 + 0x28);
  FVar3 = proto2_unittest::TestOneof2::foo_case(pTVar1);
  if (FVar3 != kFooBytes) {
    proto2_unittest::TestOneof2::clear_foo(pTVar1);
    proto2_unittest::TestOneof2::set_has_foo_bytes(pTVar1);
    protobuf::internal::ArenaStringPtr::InitDefault
              ((ArenaStringPtr *)((long)&message1_2.field_0 + 0x10));
  }
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  protobuf::internal::ArenaStringPtr::SetBytes
            ((ArenaStringPtr *)((long)&message1_2.field_0 + 0x10),"moo",pAVar7);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong
                    ((TestOneof2 *)((long)&message2_2.field_0 + 0x28));
  start_2._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_3a8);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_3a8);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2_2.field_0 + 0x28),puVar5);
  local_3d8 = (long)gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_3d0,"size","end - start",(int *)((long)&start_2 + 4),&local_3d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x737,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  local_410 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_3a8);
  local_3f9 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)((long)&data_2.field_2 + 8),local_410);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_3f8,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x738,pcVar6);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  psVar8 = proto2_unittest::TestOneof2::foo_bytes_abi_cxx11_
                     ((TestOneof2 *)((long)&data_2.field_2 + 8));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_450,"message2.foo_bytes()","\"moo\"",psVar8,(char (*) [4])0x1cef5a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(&local_458);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message1_3.field_0 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x739,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message1_3.field_0 + 0x28),&local_458);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message1_3.field_0 + 0x28));
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  std::__cxx11::string::~string(local_3a8);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&data_2.field_2 + 8));
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2_2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2_3.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&data_3.field_2 + 8));
  std::__cxx11::string::string(local_500);
  proto2_unittest::TestOneof2::set_foo_enum
            ((TestOneof2 *)((long)&message2_3.field_0 + 0x28),TestOneof2_NestedEnum_FOO);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong
                    ((TestOneof2 *)((long)&message2_3.field_0 + 0x28));
  start_3._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_500);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_500);
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2_3.field_0 + 0x28),puVar5);
  local_530 = (long)gtest_ar_6.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_528,"size","end - start",(int *)((long)&start_3 + 4),&local_530);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar2) {
    testing::Message::Message(&local_538);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x745,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_568 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_500);
  local_551 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)((long)&data_3.field_2 + 8),local_568);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_550,&local_551,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar2) {
    testing::Message::Message(&local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_550,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x746,pcVar6);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  local_5ac = proto2_unittest::TestOneof2::foo_enum((TestOneof2 *)((long)&data_3.field_2 + 8));
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestOneof2_NestedEnum,_proto2_unittest::TestOneof2_NestedEnum,_nullptr>
            ((EqHelper *)local_5a8,"message2.foo_enum()","::proto2_unittest::TestOneof2::FOO",
             &local_5ac,&proto2_unittest::TestOneof2::FOO);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar2) {
    testing::Message::Message(&local_5b8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message1_4.field_0 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x747,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message1_4.field_0 + 0x28),&local_5b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message1_4.field_0 + 0x28));
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  std::__cxx11::string::~string(local_500);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&data_3.field_2 + 8));
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2_3.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2_4.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&data_4.field_2 + 8));
  std::__cxx11::string::string(local_660);
  pTVar9 = proto2_unittest::TestOneof2::mutable_foo_message
                     ((TestOneof2 *)((long)&message2_4.field_0 + 0x28));
  proto2_unittest::TestOneof2_NestedMessage::set_moo_int(pTVar9,0xea);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong
                    ((TestOneof2 *)((long)&message2_4.field_0 + 0x28));
  start_4._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_660);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_660);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2_4.field_0 + 0x28),puVar5);
  local_690 = (long)gtest_ar_8.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_688,"size","end - start",(int *)((long)&start_4 + 4),&local_690);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar2) {
    testing::Message::Message(&local_698);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x753,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  local_6c8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_660);
  local_6b1 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)((long)&data_4.field_2 + 8),local_6c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar2) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_9.message_,(internal *)local_6b0,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x754,pcVar6);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  pTVar9 = proto2_unittest::TestOneof2::foo_message((TestOneof2 *)((long)&data_4.field_2 + 8));
  local_710 = proto2_unittest::TestOneof2_NestedMessage::moo_int(pTVar9);
  local_714 = 0xea;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_708,"message2.foo_message().moo_int()","234",&local_710,&local_714);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar2) {
    testing::Message::Message(&local_720);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message1_5.field_0 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x755,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message1_5.field_0 + 0x28),&local_720);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message1_5.field_0 + 0x28));
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  std::__cxx11::string::~string(local_660);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&data_4.field_2 + 8));
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2_4.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2_5.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&data_5.field_2 + 8));
  std::__cxx11::string::string(local_7c8);
  pTVar10 = proto2_unittest::TestOneof2::mutable_foogroup
                      ((TestOneof2 *)((long)&message2_5.field_0 + 0x28));
  proto2_unittest::TestOneof2_FooGroup::set_a(pTVar10,0x159);
  sVar4 = proto2_unittest::TestOneof2::ByteSizeLong
                    ((TestOneof2 *)((long)&message2_5.field_0 + 0x28));
  start_5._4_4_ = (undefined4)sVar4;
  std::__cxx11::string::resize((ulong)local_7c8);
  puVar5 = (uint8_t *)std::__cxx11::string::operator[]((ulong)local_7c8);
  gtest_ar_10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf::MessageLite::SerializeWithCachedSizesToArray
                   ((MessageLite *)((long)&message2_5.field_0 + 0x28),puVar5);
  local_7f8 = (long)gtest_ar_10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - (long)puVar5;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_7f0,"size","end - start",(int *)((long)&start_5 + 4),&local_7f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar2) {
    testing::Message::Message(&local_800);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x761,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  local_830 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_7c8);
  local_819 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)((long)&data_5.field_2 + 8),local_830);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_818,&local_819,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar2) {
    testing::Message::Message(&local_838);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_818,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x762,pcVar6);
    testing::internal::AssertHelper::operator=(&local_840,&local_838);
    testing::internal::AssertHelper::~AssertHelper(&local_840);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  pTVar10 = proto2_unittest::TestOneof2::foogroup((TestOneof2 *)((long)&data_5.field_2 + 8));
  local_874 = proto2_unittest::TestOneof2_FooGroup::a(pTVar10);
  local_878 = 0x159;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_870,"message2.foogroup().a()","345",&local_874,&local_878);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar2) {
    testing::Message::Message(&local_880);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              (&local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x763,pcVar6);
    testing::internal::AssertHelper::operator=(&local_888,&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_888);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  std::__cxx11::string::~string(local_7c8);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&data_5.field_2 + 8));
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2_5.field_0 + 0x28));
  return;
}

Assistant:

TEST_F(OneofTest, SerializationToArray) {
  // Primitive type
  {
    UNITTEST::TestOneof2 message1, message2;
std::string data;
message1.set_foo_int(123);
int size = message1.ByteSizeLong();
data.resize(size);
uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
EXPECT_EQ(size, end - start);
EXPECT_TRUE(message2.ParseFromString(data));
EXPECT_EQ(message2.foo_int(), 123);
  }

  // String
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_string("foo");
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_string(), "foo");
  }


  // Bytes
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_bytes("moo");
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_bytes(), "moo");
  }

  // Enum
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.set_foo_enum(UNITTEST::TestOneof2::FOO);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_enum(), UNITTEST::TestOneof2::FOO);
  }

  // Message
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.mutable_foo_message()->set_moo_int(234);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foo_message().moo_int(), 234);
  }

  // Group
  {
    UNITTEST::TestOneof2 message1, message2;
    std::string data;
    message1.mutable_foogroup()->set_a(345);
    int size = message1.ByteSizeLong();
    data.resize(size);
    uint8_t* start = reinterpret_cast<uint8_t*>(&data[0]);
    uint8_t* end = message1.SerializeWithCachedSizesToArray(start);
    EXPECT_EQ(size, end - start);
    EXPECT_TRUE(message2.ParseFromString(data));
    EXPECT_EQ(message2.foogroup().a(), 345);
  }

}